

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_199c2b::ProducedNodeTask::start(ProducedNodeTask *this,TaskInterface ti)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppCVar2;
  _func_int *p_Var3;
  Node *pNVar4;
  StringRef str;
  Command *pCVar5;
  BuildEngineDelegate *pBVar6;
  void *pvVar7;
  pointer pcVar8;
  KeyType local_98;
  TaskInterface local_78;
  BuildKey local_68;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> local_48
  ;
  
  pvVar7 = ti.ctx;
  pcVar8 = (pointer)ti.impl;
  ppCVar2 = (this->node->producers).
            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_78.impl = pcVar8;
  local_78.ctx = pvVar7;
  if ((long)(this->node->producers).
            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 == 8) {
    pCVar5 = *ppCVar2;
  }
  else {
    local_98.key._M_dataplus._M_p = pcVar8;
    local_98.key._M_string_length = (size_type)pvVar7;
    pBVar6 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_98);
    p_Var3 = pBVar6[1]._vptr_BuildEngineDelegate[1];
    pNVar4 = this->node;
    std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
    vector((vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            *)&local_98,&pNVar4->producers);
    pCVar5 = (Command *)(**(code **)(*(long *)p_Var3 + 0x88))(p_Var3,pNVar4,&local_98);
    if (local_98.key._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_98.key._M_dataplus._M_p,
                      local_98.key.field_2._M_allocated_capacity -
                      (long)local_98.key._M_dataplus._M_p);
    }
  }
  if (pCVar5 == (Command *)0x0) {
    local_98.key._M_dataplus._M_p = pcVar8;
    local_98.key._M_string_length = (size_type)pvVar7;
    pBVar6 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_98);
    p_Var3 = pBVar6[1]._vptr_BuildEngineDelegate[1];
    pNVar4 = this->node;
    std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
    vector(&local_48,&pNVar4->producers);
    (**(code **)(*(long *)p_Var3 + 0x90))(p_Var3,pNVar4,&local_48);
    if (local_48.
        super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    this->isInvalid = true;
  }
  else {
    this->producingCommand = pCVar5;
    str.Data = (pCVar5->name)._M_dataplus._M_p;
    str.Length = (pCVar5->name)._M_string_length;
    llbuild::buildsystem::BuildKey::BuildKey(&local_68,'C',str);
    paVar1 = &local_98.key.field_2;
    local_98.key._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_68.key.key._M_dataplus._M_p,
               local_68.key.key._M_dataplus._M_p + local_68.key.key._M_string_length);
    llbuild::core::TaskInterface::request(&local_78,&local_98,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.key._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.key._M_dataplus._M_p,local_98.key.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.key.key._M_dataplus._M_p != &local_68.key.key.field_2) {
      operator_delete(local_68.key.key._M_dataplus._M_p,
                      local_68.key.key.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Request the producer command.
    auto getCommand = [&]()->Command* {
      if (node.getProducers().size() == 1) {
        return node.getProducers()[0];
      }
      // Give the delegate a chance to resolve to a single command.
      return getBuildSystem(ti).getDelegate().
          chooseCommandFromMultipleProducers(&node, node.getProducers());
    };

    if (Command* foundCommand = getCommand()) {
      producingCommand = foundCommand;
      ti.request(BuildKey::makeCommand(producingCommand->getName()).toData(),
                 /*InputID=*/0);
      return;
    }

    // Notify that we could not resolve to a single producer.
    getBuildSystem(ti).getDelegate().
        cannotBuildNodeDueToMultipleProducers(&node, node.getProducers());
    isInvalid = true;
  }